

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O1

void print_utf16(unsigned_long val)

{
  _Alloc_hider _Var1;
  ostream *poVar2;
  unsigned_long in_RDX;
  int in_R8D;
  size_type sVar3;
  string result;
  string local_70;
  string local_50;
  
  QUtil::toUTF16_abi_cxx11_(&local_50,(QUtil *)val,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
  QUtil::uint_to_string_base_abi_cxx11_(&local_70,(QUtil *)val,0x10,0,in_R8D);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ->",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Var1._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_string_length != 0) {
    sVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      QUtil::int_to_string_base_abi_cxx11_
                (&local_70,(QUtil *)(ulong)(byte)_Var1._M_p[sVar3],0x10,2,in_R8D);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      sVar3 = sVar3 + 1;
    } while (local_50._M_string_length != sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void
print_utf16(unsigned long val)
{
    std::string result = QUtil::toUTF16(val);
    std::cout << "0x" << QUtil::uint_to_string_base(val, 16) << " ->";
    for (auto const& ch: result) {
        std::cout << " "
                  << QUtil::int_to_string_base(
                         static_cast<int>(static_cast<unsigned char>(ch)), 16, 2);
    }
    std::cout << std::endl;
}